

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UnicodeString *
icu_63::TimeZoneFormat::truncateOffsetPattern
          (UnicodeString *offsetHM,UnicodeString *result,UErrorCode *status)

{
  int32_t iVar1;
  int32_t iVar2;
  UChar HH [2];
  UnicodeString local_70;
  
  UnicodeString::setToBogus(result);
  if (U_ZERO_ERROR < *status) {
    return result;
  }
  iVar1 = UnicodeString::indexOf(offsetHM,L"mm",2,0);
  if (iVar1 < 0) {
LAB_001fb251:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    HH[0] = L'H';
    HH[1] = L'H';
    UnicodeString::tempSubString(&local_70,offsetHM,0,iVar1);
    iVar2 = UnicodeString::lastIndexOf(&local_70,HH,2,0);
    UnicodeString::~UnicodeString(&local_70);
    if (iVar2 < 0) {
      UnicodeString::tempSubString(&local_70,offsetHM,0,iVar1);
      iVar1 = UnicodeString::lastIndexOf(&local_70,L'H',0);
      UnicodeString::~UnicodeString(&local_70);
      if (iVar1 < 0) goto LAB_001fb251;
      UnicodeString::tempSubString(&local_70,offsetHM,0,iVar1 + 1);
      result = UnicodeString::setTo(result,&local_70);
    }
    else {
      UnicodeString::tempSubString(&local_70,offsetHM,0,iVar2 + 2);
      result = UnicodeString::setTo(result,&local_70);
    }
    UnicodeString::~UnicodeString(&local_70);
  }
  return result;
}

Assistant:

UnicodeString&
TimeZoneFormat::truncateOffsetPattern(const UnicodeString& offsetHM, UnicodeString& result, UErrorCode& status) {
    result.setToBogus();
    if (U_FAILURE(status)) {
        return result;
    }
    U_ASSERT(u_strlen(DEFAULT_GMT_OFFSET_MINUTE_PATTERN) == 2);

    int32_t idx_mm = offsetHM.indexOf(DEFAULT_GMT_OFFSET_MINUTE_PATTERN, 2, 0);
    if (idx_mm < 0) {
        // Bad time zone hour pattern data
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }
    UChar HH[] = {0x0048, 0x0048};
    int32_t idx_HH = offsetHM.tempSubString(0, idx_mm).lastIndexOf(HH, 2, 0);
    if (idx_HH >= 0) {
        return result.setTo(offsetHM.tempSubString(0, idx_HH + 2));
    }
    int32_t idx_H = offsetHM.tempSubString(0, idx_mm).lastIndexOf((UChar)0x0048, 0);
    if (idx_H >= 0) {
        return result.setTo(offsetHM.tempSubString(0, idx_H + 1));
    }
    // Bad time zone hour pattern data
    status = U_ILLEGAL_ARGUMENT_ERROR;
    return result;
}